

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  value_type vVar6;
  
  vVar6 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  pdVar5 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar5 = (pFVar2->dx_).ptr_to_data + i;
  }
  pFVar3 = (pFVar1->fadexpr_).right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  return vVar6 - (*pdVar5 * pFVar3->val_ + *pdVar4 * pFVar2->val_) /
                 (this->right_->fadexpr_).right_.constant_;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}